

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_check_collision_ray_sphere_ex
                (rf_ray ray,rf_vec3 center,float radius,rf_vec3 *collision_point)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = center.x - ray.position.x;
  fVar2 = center.y - ray.position.y;
  fVar3 = center.z - ray.position.z;
  fVar4 = SQRT(fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2);
  fVar1 = fVar3 * ray.direction.z + fVar1 * ray.direction.x + fVar2 * ray.direction.y;
  fVar2 = radius * radius - (fVar4 * fVar4 - fVar1 * fVar1);
  if (fVar2 < 0.0) {
    fVar3 = sqrtf(fVar2);
  }
  else {
    fVar3 = SQRT(fVar2);
  }
  fVar1 = fVar1 + (float)(~-(uint)(fVar4 < radius) & (uint)-fVar3 |
                         (uint)fVar3 & -(uint)(fVar4 < radius));
  collision_point->x = ray.position.x + ray.direction.x * fVar1;
  collision_point->y = ray.position.y + ray.direction.y * fVar1;
  collision_point->z = ray.position.z + ray.direction.z * fVar1;
  return 0.0 <= fVar2;
}

Assistant:

RF_API bool rf_check_collision_ray_sphere_ex(rf_ray ray, rf_vec3 center, float radius, rf_vec3 *collision_point)
{
    bool collision = false;

    rf_vec3 ray_sphere_pos = rf_vec3_sub(center, ray.position);
    float distance = rf_vec3_len(ray_sphere_pos);
    float vector = rf_vec3_dot_product(ray_sphere_pos, ray.direction);
    float d = radius * radius - (distance * distance - vector * vector);

    if (d >= 0.0f) collision = true;

// Check if ray origin is inside the sphere to calculate the correct collision point
    float collision_distance = 0;

    if (distance < radius) collision_distance = vector + sqrtf(d);
    else collision_distance = vector - sqrtf(d);

// Calculate collision point
    rf_vec3 c_point = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, collision_distance));

    collision_point->x = c_point.x;
    collision_point->y = c_point.y;
    collision_point->z = c_point.z;

    return collision;
}